

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

opj_bool t2_decode_packet_v2(opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_tcp_v2_t *p_tcp,
                            opj_pi_iterator_t *p_pi,OPJ_BYTE *p_src,OPJ_UINT32 *p_data_read,
                            OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info)

{
  opj_bool oVar1;
  OPJ_UINT32 *in_RCX;
  OPJ_BYTE *in_RDX;
  opj_pi_iterator_t *in_RSI;
  opj_tcd_tile_v2_t *in_RDI;
  undefined8 in_R8;
  OPJ_UINT32 p_max_length_00;
  undefined4 *in_R9;
  opj_packet_info_t *in_stack_00000010;
  OPJ_UINT32 l_nb_total_bytes_read;
  OPJ_UINT32 l_nb_bytes_read;
  opj_bool l_read_data;
  undefined4 in_stack_00000074;
  opj_packet_info_t *in_stack_00000080;
  int local_3c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  p_max_length_00 = (OPJ_UINT32)((ulong)in_R8 >> 0x20);
  *in_R9 = 0;
  oVar1 = t2_read_packet_header
                    (p_t2,p_tile,p_tcp,p_pi,(opj_bool *)p_src,(OPJ_BYTE *)p_data_read,
                     (OPJ_UINT32 *)CONCAT44(in_stack_00000074,p_max_length),(OPJ_UINT32)p_pack_info,
                     in_stack_00000080);
  if (oVar1 == 0) {
    oVar1 = 0;
  }
  else if ((local_3c == 0) ||
          (oVar1 = t2_read_packet_data((opj_t2_v2_t *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,in_RDI,in_RSI,in_RDX,in_RCX,p_max_length_00,
                                       in_stack_00000010), oVar1 != 0)) {
    *in_R9 = 0;
    oVar1 = 1;
  }
  else {
    oVar1 = 0;
  }
  return oVar1;
}

Assistant:

static opj_bool t2_decode_packet_v2(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
                             opj_tcp_v2_t *p_tcp,
							 opj_pi_iterator_t *p_pi,
							 OPJ_BYTE *p_src,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *p_pack_info)
{
	opj_bool l_read_data;
	OPJ_UINT32 l_nb_bytes_read = 0;
	OPJ_UINT32 l_nb_total_bytes_read = 0;

	*p_data_read = 0;

	if (! t2_read_packet_header(p_t2,p_tile,p_tcp,p_pi,&l_read_data,p_src,&l_nb_bytes_read,p_max_length,p_pack_info)) {
		return OPJ_FALSE;
	}

	p_src += l_nb_bytes_read;
	l_nb_total_bytes_read += l_nb_bytes_read;
	p_max_length -= l_nb_bytes_read;

	/* we should read data for the packet */
	if (l_read_data) {
		l_nb_bytes_read = 0;

		if (! t2_read_packet_data(p_t2,p_tile,p_pi,p_src,&l_nb_bytes_read,p_max_length,p_pack_info)) {
			return OPJ_FALSE;
		}

		l_nb_total_bytes_read += l_nb_bytes_read;
	}

	*p_data_read = l_nb_total_bytes_read;

	return OPJ_TRUE;
}